

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O2

SquareMatrix<float> __thiscall
qclab::dense::conjTrans<qclab::dense::SquareMatrix<float>>(dense *this,SquareMatrix<float> *A)

{
  data_type extraout_RDX;
  SquareMatrix<float> SVar1;
  
  SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)this,A);
  operateInPlace<qclab::dense::SquareMatrix<float>>(ConjTrans,(SquareMatrix<float> *)this);
  SVar1.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)this;
  return SVar1;
}

Assistant:

T conjTrans( const T& A ) {
      T AconjTrans( A ) ;
      operateInPlace( Op::ConjTrans , AconjTrans ) ;
      return AconjTrans ;
    }